

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_batchcompute.cc
# Opt level: O2

BatchCompute *
aliyun::BatchCompute::CreateBatchComputeClient(string *endpoint,string *appid,string *secret)

{
  BatchCompute *this;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string host_name;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)endpoint);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"BatchCompute",&local_e9);
  AliGetEndpointHost(&host_name,&local_48,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  if (host_name._M_string_length == 0) {
    this = (BatchCompute *)0x0;
  }
  else {
    this = (BatchCompute *)operator_new(0x30);
    std::__cxx11::string::string((string *)&local_a8,(string *)&host_name);
    std::__cxx11::string::string((string *)&local_c8,(string *)appid);
    std::__cxx11::string::string((string *)&local_e8,(string *)secret);
    BatchCompute(this,&local_a8,&local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::__cxx11::string::~string((string *)&host_name);
  return this;
}

Assistant:

BatchCompute* BatchCompute::CreateBatchComputeClient(std::string endpoint, std::string appid, std::string secret) {
    std::string host_name = AliGetEndpointHost(endpoint, "BatchCompute");
    if(host_name.empty()) {
      return NULL;
    }
    return new BatchCompute(host_name, appid, secret);
  }